

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

void __thiscall embree::Device::execute(Device *this,bool join,function<void_()> *func)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,join) != 0) {
    tbb::detail::d1::task_arena::execute_impl<void,std::function<void()>const>
              ((task_arena *)
               (((this->arena)._M_t.
                 super___uniq_ptr_impl<embree::TaskArena,_std::default_delete<embree::TaskArena>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_embree::TaskArena_*,_std::default_delete<embree::TaskArena>_>
                 .super__Head_base<0UL,_embree::TaskArena_*,_false>._M_head_impl)->arena)._M_t,func)
    ;
    return;
  }
  std::function<void_()>::operator()(func);
  return;
}

Assistant:

void Device::execute(bool join, const std::function<void()>& func)
  {
#if USE_TASK_ARENA
    if (join) {
      arena->arena->execute(func);
    }
    else
#endif
    {
      func();
    }
  }